

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::
PlainSelectTemplatedInternal<duckdb::string_t,duckdb::StringParquetValueConversion,false,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          Vector *result,SelectionVector *sel,idx_t approved_tuple_count)

{
  data_ptr_t pdVar1;
  idx_t i;
  ulong uVar2;
  ulong uVar3;
  ulong row_offset;
  string_t sVar4;
  
  pdVar1 = result->data;
  FlatVector::VerifyFlatVector(result);
  row_offset = 0;
  for (uVar2 = 0; approved_tuple_count != uVar2; uVar2 = uVar2 + 1) {
    uVar3 = uVar2;
    if (sel->sel_vector != (sel_t *)0x0) {
      uVar3 = (ulong)sel->sel_vector[uVar2];
    }
    PlainSkipTemplatedInternal<duckdb::StringParquetValueConversion,false,true>
              (this,plain_data,defines,uVar3 - row_offset,row_offset);
    sVar4 = StringParquetValueConversion::PlainRead<true>(plain_data,this);
    *(long *)(pdVar1 + uVar3 * 0x10) = sVar4.value._0_8_;
    *(long *)(pdVar1 + uVar3 * 0x10 + 8) = sVar4.value._8_8_;
    row_offset = uVar3 + 1;
  }
  if (row_offset <= num_values && num_values - row_offset != 0) {
    PlainSkipTemplatedInternal<duckdb::StringParquetValueConversion,false,true>
              (this,plain_data,defines,num_values - row_offset,row_offset);
    return;
  }
  return;
}

Assistant:

void PlainSelectTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines,
	                                  const uint64_t num_values, Vector &result, const SelectionVector &sel,
	                                  idx_t approved_tuple_count) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		auto &result_mask = FlatVector::Validity(result);
		idx_t current_entry = 0;
		for (idx_t i = 0; i < approved_tuple_count; i++) {
			auto next_entry = sel.get_index(i);
			D_ASSERT(current_entry <= next_entry);
			// perform any skips forward if required
			PlainSkipTemplatedInternal<CONVERSION, HAS_DEFINES, CHECKED>(plain_data, defines,
			                                                             next_entry - current_entry, current_entry);
			// read this row
			if (HAS_DEFINES && defines[next_entry] != MaxDefine()) {
				result_mask.SetInvalid(next_entry);
			} else {
				result_ptr[next_entry] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
			}
			current_entry = next_entry + 1;
		}
		if (current_entry < num_values) {
			// skip forward to the end of where we are selecting
			PlainSkipTemplatedInternal<CONVERSION, HAS_DEFINES, CHECKED>(plain_data, defines,
			                                                             num_values - current_entry, current_entry);
		}
	}